

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O0

void __thiscall HighsHessian::deleteCols(HighsHessian *this,HighsIndexCollection *index_collection)

{
  reference pvVar1;
  reference pvVar2;
  HighsIndexCollection *in_RSI;
  int *in_RDI;
  HighsInt iRow_1;
  HighsInt iEl_1;
  HighsInt iCol_3;
  HighsInt iRow;
  HighsInt iEl;
  HighsInt iCol_2;
  HighsInt k_1;
  vector<int,_std::allocator<int>_> save_start;
  HighsInt new_num_entries;
  HighsInt new_num_nz;
  HighsInt check_new_dim;
  HighsInt iCol_1;
  HighsInt iCol;
  HighsInt k;
  HighsInt new_dim;
  vector<int,_std::allocator<int>_> new_index;
  HighsInt current_set_entry;
  HighsInt keep_to_col;
  HighsInt keep_from_col;
  HighsInt delete_to_col;
  HighsInt delete_from_col;
  HighsInt to_k;
  HighsInt from_k;
  undefined4 in_stack_ffffffffffffff08;
  int iVar3;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar4;
  HighsHessian *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  HighsInt *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  HighsIndexCollection *index_collection_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar5;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_98;
  int local_94;
  vector<int,_std::allocator<int>_> local_90;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  undefined4 local_4c;
  undefined4 local_2c;
  int local_28;
  int local_24;
  int local_1c;
  int local_18;
  int local_14;
  
  if ((*in_RDI != 0) &&
     (limits(in_RSI,&stack0xffffffffffffffec,&stack0xffffffffffffffe8), local_14 <= local_18)) {
    local_28 = -1;
    local_2c = 0;
    index_collection_00 = (HighsIndexCollection *)&stack0xffffffffffffffb8;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6b5958);
    local_4c = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10,
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (value_type_conflict2 *)0x6b597d);
    local_60 = 0;
    for (local_64 = local_14; local_64 <= local_18; local_64 = local_64 + 1) {
      updateOutInIndex(index_collection_00,
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff28,
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (local_64 == local_14) {
        for (local_68 = 0; local_68 < local_1c; local_68 = local_68 + 1) {
          in_stack_ffffffffffffff3c = local_60;
          local_60 = local_60 + 1;
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8,
                              (long)local_68);
          *pvVar1 = in_stack_ffffffffffffff3c;
        }
      }
      for (local_6c = local_24; local_6c <= local_28; local_6c = local_6c + 1) {
        in_stack_ffffffffffffff38 = local_60;
        local_60 = local_60 + 1;
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8,
                            (long)local_6c);
        *pvVar1 = in_stack_ffffffffffffff38;
      }
      if (*in_RDI + -1 <= local_28) break;
    }
    local_28 = -1;
    local_2c = 0;
    local_70 = local_60;
    local_60 = 0;
    local_74 = 0;
    local_78 = 0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    for (local_94 = local_14; local_94 <= local_18; local_94 = local_94 + 1) {
      updateOutInIndex(index_collection_00,
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff28,
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      iVar5 = local_24;
      if (local_94 == local_14) {
        for (local_98 = 0; iVar5 = local_24, local_98 < local_1c; local_98 = local_98 + 1) {
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_98);
          in_stack_ffffffffffffff34 = *pvVar1;
          while (iVar5 = in_stack_ffffffffffffff34,
                pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_90,(long)(local_98 + 1)),
                in_stack_ffffffffffffff34 < *pvVar1) {
            pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)iVar5);
            pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8,
                                (long)*pvVar1);
            iVar3 = *pvVar1;
            if (-1 < iVar3) {
              pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_78);
              *pvVar1 = iVar3;
              pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                                  (long)iVar5);
              in_stack_ffffffffffffff28 = (HighsInt *)*pvVar2;
              pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                                  (long)local_78);
              *pvVar2 = (value_type)in_stack_ffffffffffffff28;
              pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                                  (long)local_78);
              if ((*pvVar2 != 0.0) || (NAN(*pvVar2))) {
                local_74 = local_74 + 1;
              }
              local_78 = local_78 + 1;
              in_stack_ffffffffffffff24 = iVar3;
            }
            in_stack_ffffffffffffff34 = iVar5 + 1;
          }
          local_60 = local_60 + 1;
          in_stack_ffffffffffffff20 = local_78;
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_60);
          *pvVar1 = in_stack_ffffffffffffff20;
        }
      }
      for (; iVar5 <= local_28; iVar5 = iVar5 + 1) {
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)iVar5);
        in_stack_ffffffffffffff1c = *pvVar1;
        while (iVar3 = in_stack_ffffffffffffff1c,
              pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&local_90,(long)(iVar5 + 1)), in_stack_ffffffffffffff1c < *pvVar1)
        {
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)iVar3);
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8,
                              (long)*pvVar1);
          iVar4 = *pvVar1;
          if (-1 < iVar4) {
            pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_78);
            *pvVar1 = iVar4;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                                (long)iVar3);
            in_stack_ffffffffffffff10 = (HighsHessian *)*pvVar2;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                                (long)local_78);
            *pvVar2 = (value_type)in_stack_ffffffffffffff10;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                                (long)local_78);
            if ((*pvVar2 != 0.0) || (NAN(*pvVar2))) {
              local_74 = local_74 + 1;
            }
            local_78 = local_78 + 1;
          }
          in_stack_ffffffffffffff1c = iVar3 + 1;
        }
        local_60 = local_60 + 1;
        iVar3 = local_78;
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_60);
        *pvVar1 = iVar3;
      }
      if (*in_RDI + -1 <= local_28) break;
    }
    *in_RDI = local_60;
    if (local_74 == 0) {
      clear(in_stack_ffffffffffffff10);
    }
    else {
      exactResize(in_stack_ffffffffffffff10);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  return;
}

Assistant:

void HighsHessian::deleteCols(const HighsIndexCollection& index_collection) {
  if (this->dim_ == 0) return;
  // Can't handle non-triangular matrices yet
  assert(this->format_ == HessianFormat::kTriangular);
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;
  HighsInt delete_from_col;
  HighsInt delete_to_col;
  HighsInt keep_from_col;
  HighsInt keep_to_col = -1;
  HighsInt current_set_entry = 0;

  // Initial pass creates a look-up to for the new index of columns
  // being retained, and -1 for columns being deleted
  std::vector<HighsInt> new_index;
  new_index.assign(this->dim_, -1);
  HighsInt new_dim = 0;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_col, delete_to_col,
                     keep_from_col, keep_to_col, current_set_entry);
    if (k == from_k) {
      // Account for the initial columns being kept
      for (HighsInt iCol = 0; iCol < delete_from_col; iCol++)
        new_index[iCol] = new_dim++;
    }
    for (HighsInt iCol = keep_from_col; iCol <= keep_to_col; iCol++)
      new_index[iCol] = new_dim++;
    // When using a mask, to_k = this->dim_, but consecutive
    // keep/delete entries are accumulated, so may not need all passes
    if (keep_to_col >= this->dim_ - 1) break;
  }
  assert(new_dim < this->dim_);
  // Now perform the pass that deletes rows/columns
  keep_to_col = -1;
  current_set_entry = 0;
  // Have to accumulate new number of entries from the outset, as
  // entries may be lost from columns being kept before any are
  // deleted. Also keep a count of the number of nonzeros, in case the new
  HighsInt check_new_dim = new_dim;
  new_dim = 0;
  HighsInt new_num_nz = 0;
  HighsInt new_num_entries = 0;
  std::vector<HighsInt> save_start = this->start_;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_col, delete_to_col,
                     keep_from_col, keep_to_col, current_set_entry);
    if (k == from_k) {
      // Account for the initial columns being kept
      for (HighsInt iCol = 0; iCol < delete_from_col; iCol++) {
        assert(new_index[iCol] >= 0);
        for (HighsInt iEl = save_start[iCol]; iEl < save_start[iCol + 1];
             iEl++) {
          HighsInt iRow = new_index[this->index_[iEl]];
          if (iRow < 0) continue;
          this->index_[new_num_entries] = iRow;
          this->value_[new_num_entries] = this->value_[iEl];
          if (this->value_[new_num_entries]) new_num_nz++;
          new_num_entries++;
        }
        new_dim++;
        this->start_[new_dim] = new_num_entries;
      }
      assert(new_dim == delete_from_col);
    }
    for (HighsInt iCol = keep_from_col; iCol <= keep_to_col; iCol++) {
      assert(new_index[iCol] >= 0);
      for (HighsInt iEl = save_start[iCol]; iEl < save_start[iCol + 1]; iEl++) {
        HighsInt iRow = new_index[this->index_[iEl]];
        if (iRow < 0) continue;
        this->index_[new_num_entries] = iRow;
        this->value_[new_num_entries] = this->value_[iEl];
        if (this->value_[new_num_entries]) new_num_nz++;
        new_num_entries++;
      }
      new_dim++;
      this->start_[new_dim] = new_num_entries;
    }
    if (keep_to_col >= this->dim_ - 1) break;
  }
  assert(new_dim == check_new_dim);
  this->dim_ = new_dim;
  if (!new_num_nz) {
    this->clear();
  } else {
    this->exactResize();
  }
}